

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_tree_detail.h
# Opt level: O0

void __thiscall
st_tree::detail::max_maintainer<unsigned_long,_std::allocator<str1>_>::insert
          (max_maintainer<unsigned_long,_std::allocator<str1>_> *this,
          max_maintainer<unsigned_long,_std::allocator<str1>_> *src,unsigned_long *d)

{
  ulong uVar1;
  value_type vVar2;
  size_type sVar3;
  const_reference pvVar4;
  reference pvVar5;
  ulong local_30;
  size_type s;
  unsigned_long *local_20;
  unsigned_long *d_local;
  max_maintainer<unsigned_long,_std::allocator<str1>_> *src_local;
  max_maintainer<unsigned_long,_std::allocator<str1>_> *this_local;
  
  local_20 = d;
  d_local = (unsigned_long *)src;
  src_local = this;
  sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&src->_hist);
  if (sVar3 != 0) {
    if (this->_max < d_local[4] + *local_20) {
      this->_max = d_local[4] + *local_20;
    }
    uVar1 = this->_max;
    sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->_hist);
    if (sVar3 <= uVar1) {
      s = 0;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                (&this->_hist,this->_max + 1,&s);
    }
    for (local_30 = 0; local_30 <= d_local[4]; local_30 = local_30 + 1) {
      pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(d_local + 1),
                          local_30);
      vVar2 = *pvVar4;
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->_hist,local_30 + *local_20);
      *pvVar5 = vVar2 + *pvVar5;
    }
  }
  return;
}

Assistant:

void insert(const max_maintainer& src, const Unsigned& d) {
        if (src._hist.size() <= 0) return;
        if ((src._max + d) > _max) _max = src._max + d;
        if (_max >= _hist.size()) _hist.resize(1+_max, 0);
        for (size_type s = 0;  s <= src._max;  ++s) _hist[s + d] += src._hist[s];
    }